

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  byte *pbVar1;
  byte bVar2;
  undefined8 uVar3;
  ushort uVar4;
  ushort uVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  BYTE *s_1;
  ulong uVar13;
  byte *pbVar14;
  BYTE *s_2;
  BYTE *d_4;
  byte *pbVar15;
  ulong uVar16;
  BYTE *s;
  ushort *puVar17;
  ushort *puVar18;
  uint uVar19;
  byte *pbVar20;
  size_t __n;
  
  if (source == (char *)0x0) {
    uVar19 = 0xffffffff;
  }
  else {
    if (originalSize != 0) {
      pbVar1 = (byte *)(dest + originalSize);
      pbVar6 = (byte *)(dest + (long)originalSize + -8);
      pbVar10 = (byte *)(dest + (long)originalSize + -0x1a);
      iVar8 = (int)source;
      if (0x3f < originalSize) {
LAB_0010ebec:
        while( true ) {
          while( true ) {
            bVar2 = (byte)*(ushort *)source;
            uVar12 = (uint)bVar2;
            uVar19 = (uint)(bVar2 >> 4);
            if (uVar19 == 0xf) {
              uVar19 = 0;
              puVar18 = (ushort *)((long)source + 0x10);
              do {
                puVar17 = puVar18;
                uVar19 = uVar19 + *(byte *)((long)puVar17 + -0xf);
                puVar18 = (ushort *)((long)puVar17 + 1);
              } while (*(byte *)((long)puVar17 + -0xf) == 0xff);
              uVar13 = (ulong)uVar19;
              pbVar9 = (byte *)dest + uVar13 + 0xf;
              if (pbVar6 < pbVar9) {
                __n = uVar13 + 0xf;
                source = (char *)(puVar17 + -7);
                goto LAB_0010ee85;
              }
              puVar18 = puVar17 + -7;
              do {
                *(undefined8 *)dest = *(undefined8 *)puVar18;
                dest = (char *)((byte *)dest + 8);
                puVar18 = puVar18 + 4;
              } while (dest < pbVar9);
              puVar18 = (ushort *)((long)puVar17 + 1 + uVar13);
            }
            else {
              *(undefined8 *)dest = *(undefined8 *)((long)source + 1);
              if (0x8f < bVar2) {
                *(undefined8 *)((byte *)dest + 8) = *(undefined8 *)((long)source + 9);
              }
              pbVar9 = (byte *)dest + uVar19;
              puVar18 = (ushort *)((byte *)((long)source + 1) + uVar19);
            }
            uVar4 = *puVar18;
            uVar16 = (ulong)uVar4;
            uVar19 = (uint)uVar4;
            source = (char *)(puVar18 + 1);
            pbVar20 = pbVar9 + -uVar16;
            uVar13 = (ulong)(bVar2 & 0xf);
            if (uVar13 != 0xf) break;
            uVar12 = 0;
            do {
              uVar5 = *(ushort *)source;
              source = (char *)((long)source + 1);
              uVar12 = uVar12 + (byte)uVar5;
            } while ((byte)uVar5 == 0xff);
            dest = (char *)(pbVar9 + (ulong)uVar12 + 0x13);
            if (pbVar1 + -0x40 <= dest) {
              uVar13 = (ulong)uVar12 + 0x13;
              goto LAB_0010eee0;
            }
            if (uVar4 < 0x10) goto LAB_0010ed0b;
            do {
              uVar3 = *(undefined8 *)(pbVar9 + -uVar16 + 8);
              *(undefined8 *)pbVar9 = *(undefined8 *)(pbVar9 + -uVar16);
              *(undefined8 *)(pbVar9 + 8) = uVar3;
              uVar3 = *(undefined8 *)(pbVar9 + -uVar16 + 0x10 + 8);
              *(undefined8 *)(pbVar9 + 0x10) = *(undefined8 *)(pbVar9 + -uVar16 + 0x10);
              *(undefined8 *)(pbVar9 + 0x18) = uVar3;
              pbVar9 = pbVar9 + 0x20;
            } while (pbVar9 < dest);
          }
          dest = (char *)(pbVar9 + uVar13 + 4);
          uVar19 = (uint)uVar4;
          if (pbVar1 + -0x40 <= dest) goto LAB_0010eedc;
          if (uVar4 < 8) break;
          *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
          *(undefined8 *)(pbVar9 + 8) = *(undefined8 *)(pbVar20 + 8);
          *(undefined2 *)(pbVar9 + 0x10) = *(undefined2 *)(pbVar20 + 0x10);
        }
LAB_0010ed0b:
        if (uVar16 == 4) {
          iVar11 = *(int *)pbVar20;
        }
        else if (uVar4 == 2) {
          iVar11 = CONCAT22(*(undefined2 *)pbVar20,*(undefined2 *)pbVar20);
        }
        else {
          if (uVar4 != 1) {
            if (uVar4 < 8) {
              pbVar9[0] = 0;
              pbVar9[1] = 0;
              pbVar9[2] = 0;
              pbVar9[3] = 0;
              *pbVar9 = *pbVar20;
              pbVar9[1] = pbVar20[1];
              pbVar9[2] = pbVar20[2];
              pbVar9[3] = pbVar20[3];
              uVar19 = inc32table[uVar4];
              *(undefined4 *)(pbVar9 + 4) = *(undefined4 *)(pbVar20 + uVar19);
              pbVar20 = pbVar20 + ((ulong)uVar19 - (long)dec64table[uVar4]);
            }
            else {
              *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
              pbVar20 = pbVar20 + 8;
            }
            pbVar9 = pbVar9 + 8;
            do {
              *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
              pbVar9 = pbVar9 + 8;
              pbVar20 = pbVar20 + 8;
            } while (pbVar9 < dest);
            goto LAB_0010ebec;
          }
          iVar11 = (uint)*pbVar20 * 0x1010101;
        }
        do {
          *(int *)pbVar9 = iVar11;
          *(int *)(pbVar9 + 4) = iVar11;
          pbVar9 = pbVar9 + 8;
        } while (pbVar9 < dest);
        goto LAB_0010ebec;
      }
      while( true ) {
        while( true ) {
          uVar4 = *(ushort *)source;
          uVar12 = (uint)(byte)uVar4;
          source = (char *)((long)source + 1);
          uVar19 = (uint)(byte)((byte)uVar4 >> 4);
          __n = (size_t)uVar19;
          if ((0x8f < uVar12) || (pbVar10 < dest)) break;
          *(undefined8 *)dest = *(undefined8 *)source;
          pbVar9 = (byte *)dest + __n;
          uVar13 = (ulong)(uVar12 & 0xf);
          puVar18 = (ushort *)((long)source + __n);
          source = (char *)(puVar18 + 1);
          uVar4 = *puVar18;
          pbVar20 = pbVar9 + -(ulong)uVar4;
          if ((uVar13 == 0xf) || (uVar4 < 8)) goto LAB_0010eeba;
          *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
          *(undefined8 *)(pbVar9 + 8) = *(undefined8 *)(pbVar20 + 8);
          *(undefined2 *)(pbVar9 + 0x10) = *(undefined2 *)(pbVar20 + 0x10);
          dest = (char *)(pbVar9 + uVar13 + 4);
        }
        if (uVar19 == 0xf) {
          uVar19 = 0;
          do {
            uVar4 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar19 = uVar19 + (byte)uVar4;
          } while ((byte)uVar4 == 0xff);
          __n = (ulong)uVar19 + 0xf;
        }
        pbVar9 = (byte *)dest + __n;
LAB_0010ee85:
        puVar18 = (ushort *)source;
        if (pbVar6 < pbVar9) break;
        do {
          *(undefined8 *)dest = *(undefined8 *)puVar18;
          dest = (char *)((byte *)dest + 8);
          puVar18 = puVar18 + 4;
        } while (dest < pbVar9);
        puVar18 = (ushort *)((long)source + __n);
        source = (char *)(puVar18 + 1);
        uVar4 = *puVar18;
        pbVar20 = pbVar9 + -(ulong)uVar4;
        uVar13 = (ulong)(uVar12 & 0xf);
LAB_0010eeba:
        uVar19 = (uint)uVar4;
        if ((int)uVar13 == 0xf) {
          uVar12 = 0;
          do {
            uVar5 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar12 = uVar12 + (byte)uVar5;
          } while ((byte)uVar5 == 0xff);
          uVar13 = (ulong)uVar12 + 0xf;
        }
LAB_0010eedc:
        uVar13 = uVar13 + 4;
LAB_0010eee0:
        dest = (char *)(pbVar9 + uVar13);
        if (uVar19 < 8) {
          pbVar9[0] = 0;
          pbVar9[1] = 0;
          pbVar9[2] = 0;
          pbVar9[3] = 0;
          *pbVar9 = *pbVar20;
          pbVar9[1] = pbVar20[1];
          pbVar9[2] = pbVar20[2];
          pbVar9[3] = pbVar20[3];
          uVar16 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar19 << 2));
          *(undefined4 *)(pbVar9 + 4) = *(undefined4 *)(pbVar20 + uVar16);
          pbVar20 = pbVar20 + (uVar16 - (long)*(int *)((long)dec64table + (ulong)(uVar19 << 2)));
        }
        else {
          *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
          pbVar20 = pbVar20 + 8;
        }
        pbVar7 = pbVar9 + 8;
        if (pbVar1 + -0xc < dest) {
          if (pbVar1 + -5 < dest) goto LAB_0010ef41;
          pbVar9 = pbVar1 + -7;
          pbVar14 = pbVar20;
          pbVar15 = pbVar7;
          if (pbVar7 < pbVar9) {
            do {
              *(undefined8 *)pbVar15 = *(undefined8 *)pbVar14;
              pbVar15 = pbVar15 + 8;
              pbVar14 = pbVar14 + 8;
            } while (pbVar15 < pbVar9);
            pbVar20 = pbVar20 + ((long)pbVar9 - (long)pbVar7);
            pbVar7 = pbVar9;
          }
          for (; pbVar7 < dest; pbVar7 = pbVar7 + 1) {
            bVar2 = *pbVar20;
            pbVar20 = pbVar20 + 1;
            *pbVar7 = bVar2;
          }
        }
        else {
          *(undefined8 *)pbVar7 = *(undefined8 *)pbVar20;
          if (0x10 < uVar13) {
            pbVar9 = pbVar9 + 0x10;
            do {
              pbVar20 = pbVar20 + 8;
              *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
              pbVar9 = pbVar9 + 8;
            } while (pbVar9 < dest);
          }
        }
      }
      if (pbVar9 == pbVar1) {
        memmove(dest,source,__n);
        return ((int)source + (int)__n) - iVar8;
      }
LAB_0010ef41:
      return ~(uint)source + iVar8;
    }
    uVar19 = -(uint)(*source != '\0') | 1;
  }
  return uVar19;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}